

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::parse(Reader *this,istream *sin,Value *root,bool collectComments)

{
  bool bVar1;
  undefined1 local_48 [8];
  string doc;
  bool collectComments_local;
  Value *root_local;
  istream *sin_local;
  Reader *this_local;
  
  doc.field_2._M_local_buf[0xf] = collectComments;
  std::__cxx11::string::string((string *)local_48);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(sin,(string *)local_48,-1);
  bVar1 = parse(this,(string *)local_48,root,(bool)(doc.field_2._M_local_buf[0xf] & 1));
  std::__cxx11::string::~string((string *)local_48);
  return bVar1;
}

Assistant:

bool Reader::parse(std::istream& sin, Value& root, bool collectComments) {
  // std::istream_iterator<char> begin(sin);
  // std::istream_iterator<char> end;
  // Those would allow streamed input from a file, if parse() were a
  // template function.

  // Since std::string is reference-counted, this at least does not
  // create an extra copy.
  std::string doc;
  std::getline(sin, doc, (char)EOF);
  return parse(doc, root, collectComments);
}